

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O3

int __thiscall TPZFMatrix<double>::Decompose_LU(TPZFMatrix<double> *this)

{
  long *plVar1;
  int iVar2;
  long *plVar3;
  list<long,_std::allocator<long>_> fake;
  long *local_38;
  undefined1 *local_30;
  undefined8 local_28;
  
  local_30 = (undefined1 *)&local_38;
  local_38 = (long *)&local_38;
  local_28 = 0;
  iVar2 = (*(this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
            [0x16])(this,&local_38);
  plVar3 = local_38;
  if ((long **)local_38 != &local_38) {
    do {
      plVar1 = (long *)*plVar3;
      operator_delete(plVar3,0x18);
      plVar3 = plVar1;
    } while ((long **)plVar1 != &local_38);
  }
  return iVar2;
}

Assistant:

int TPZFMatrix<TVar>::Decompose_LU() {
    
    std::list<int64_t> fake;
    return this->Decompose_LU(fake);
}